

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::
CheckElem<int,iutest::detail::GtMatcher<int>>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,GtMatcher<int> *matcher
          )

{
  AssertionResult local_38;
  
  GtMatcher<int>::operator()(&local_38,matcher,actual);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_38.m_result;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }